

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx2::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  long lVar5;
  long lVar6;
  PrimRefMB *pPVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  uint uVar12;
  ulong uVar14;
  size_t itime;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar40;
  undefined1 auVar39 [16];
  float fVar48;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar49;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar62;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  undefined1 auVar64 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar65;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar66;
  undefined1 auVar67 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar68;
  undefined1 auVar69 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar70;
  undefined1 auVar71 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong local_218;
  unsigned_long local_1f0;
  size_t local_1e8;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  anon_class_16_2_07cfa4d6 local_160;
  ulong local_150;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  undefined1 local_138 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar13;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar18 = r->_begin;
  uVar13 = r->_end;
  if (uVar18 < uVar13) {
    local_1a8 = SUB6416(ZEXT464(0x3f800000),0);
    local_1b8 = ZEXT816(0x3f80000000000000);
    auVar47._8_4_ = 0xff800000;
    auVar47._0_8_ = 0xff800000ff800000;
    auVar47._12_4_ = 0xff800000;
    auVar60 = ZEXT1664(auVar47);
    auVar36._8_4_ = 0x7f800000;
    auVar36._0_8_ = 0x7f8000007f800000;
    auVar36._12_4_ = 0x7f800000;
    auVar61 = ZEXT1664(auVar36);
    local_1f0 = 0;
    auVar71 = ZEXT1664(auVar36);
    auVar69 = ZEXT1664(auVar47);
    auVar64 = ZEXT1664(auVar36);
    auVar67 = ZEXT1664(auVar47);
    local_1e8 = 0;
    local_218 = 0;
    do {
      BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.time_range;
      auVar25._8_8_ = 0;
      auVar25._0_4_ = BVar2.lower;
      auVar25._4_4_ = BVar2.upper;
      auVar47 = vmovshdup_avx(auVar25);
      fVar21 = BVar2.lower;
      fVar22 = auVar47._0_4_ - fVar21;
      uVar12 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>
                                   ).super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.field_0x68 * uVar18);
      uVar14 = (ulong)(uVar12 + 1);
      pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar14 < (pBVar3->super_RawBufferView).num) {
        fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.fnumTimeSegments;
        auVar47 = ZEXT416((uint)(fVar1 * ((t0t1->lower - fVar21) / fVar22) * 1.0000002));
        auVar47 = vroundss_avx(auVar47,auVar47,9);
        auVar47 = vmaxss_avx(ZEXT816(0),auVar47);
        auVar36 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar21) / fVar22) * 0.99999976));
        auVar36 = vroundss_avx(auVar36,auVar36,10);
        auVar36 = vminss_avx(auVar36,ZEXT416((uint)fVar1));
        if ((uint)(int)auVar47._0_4_ <= (uint)(int)auVar36._0_4_) {
          uVar15 = (ulong)(int)auVar47._0_4_;
          pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.tangents.items;
          lVar16 = uVar15 * 0x38 + 0x10;
          do {
            lVar5 = *(long *)((long)pBVar3 + lVar16 + -0x10);
            lVar6 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar16);
            auVar47 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar12);
            auVar52._8_4_ = 0xddccb9a2;
            auVar52._0_8_ = 0xddccb9a2ddccb9a2;
            auVar52._12_4_ = 0xddccb9a2;
            auVar25 = vcmpps_avx(auVar47,auVar52,2);
            auVar56._8_4_ = 0x5dccb9a2;
            auVar56._0_8_ = 0x5dccb9a25dccb9a2;
            auVar56._12_4_ = 0x5dccb9a2;
            auVar47 = vcmpps_avx(auVar47,auVar56,5);
            auVar47 = vorps_avx(auVar25,auVar47);
            if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar47[0xf] < '\0') goto LAB_0196a972;
            auVar47 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar14);
            auVar25 = vcmpps_avx(auVar47,auVar52,2);
            auVar47 = vcmpps_avx(auVar47,auVar56,5);
            auVar47 = vorps_avx(auVar25,auVar47);
            if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar47[0xf] < '\0') goto LAB_0196a972;
            lVar5 = *(long *)((long)pBVar4 + lVar16 + -0x10);
            lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar16);
            auVar47 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar12);
            auVar25 = vcmpps_avx(auVar47,auVar52,2);
            auVar47 = vcmpps_avx(auVar47,auVar56,5);
            auVar47 = vorps_avx(auVar25,auVar47);
            if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar47[0xf] < '\0') goto LAB_0196a972;
            auVar47 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar14);
            auVar25 = vcmpps_avx(auVar47,auVar52,2);
            auVar47 = vcmpps_avx(auVar47,auVar56,5);
            auVar47 = vorps_avx(auVar25,auVar47);
            if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar47[0xf] < '\0') goto LAB_0196a972;
            uVar15 = uVar15 + 1;
            lVar16 = lVar16 + 0x38;
          } while (uVar15 <= (ulong)(long)(int)auVar36._0_4_);
        }
        local_108 = auVar71._0_16_;
        local_f8 = auVar69._0_16_;
        local_e8 = auVar67._0_16_;
        local_d8 = auVar64._0_16_;
        local_c8 = auVar61._0_16_;
        local_b8 = auVar60._0_16_;
        fVar35 = (t0t1->lower - fVar21) / fVar22;
        fVar22 = (t0t1->upper - fVar21) / fVar22;
        fVar21 = fVar1 * fVar35;
        fVar24 = fVar1 * fVar22;
        auVar25 = vroundss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21),9);
        auVar52 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),10);
        auVar47 = vmaxss_avx(auVar25,ZEXT816(0));
        auVar36 = vminss_avx(auVar52,ZEXT416((uint)fVar1));
        iVar17 = (int)auVar47._0_4_;
        fVar34 = auVar36._0_4_;
        local_160.primID = &local_150;
        uVar12 = (int)auVar25._0_4_;
        if ((int)auVar25._0_4_ < 0) {
          uVar12 = 0xffffffff;
        }
        iVar19 = (int)fVar1 + 1;
        if ((int)auVar52._0_4_ < (int)fVar1 + 1) {
          iVar19 = (int)auVar52._0_4_;
        }
        local_160.this =
             (CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
              *)this;
        local_150 = uVar18;
        ::anon_func::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_128.field_1,&local_160,(long)iVar17);
        ::anon_func::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_148.field_1,&local_160,(long)(int)fVar34);
        fVar21 = fVar21 - auVar47._0_4_;
        if (iVar19 - uVar12 == 1) {
          auVar47 = vmaxss_avx(ZEXT416((uint)fVar21),ZEXT816(0) << 0x40);
          fVar21 = auVar47._0_4_;
          fVar22 = 1.0 - fVar21;
          auVar51._0_4_ = fVar21 * local_148.m128[0];
          auVar51._4_4_ = fVar21 * local_148.m128[1];
          auVar51._8_4_ = fVar21 * local_148.m128[2];
          auVar51._12_4_ = fVar21 * local_148.m128[3];
          auVar29._4_4_ = fVar22;
          auVar29._0_4_ = fVar22;
          auVar29._8_4_ = fVar22;
          auVar29._12_4_ = fVar22;
          auVar54 = vfmadd231ps_fma(auVar51,auVar29,(undefined1  [16])local_128);
          auVar55._0_4_ = fVar21 * local_138._0_4_;
          auVar55._4_4_ = fVar21 * local_138._4_4_;
          auVar55._8_4_ = fVar21 * local_138._8_4_;
          auVar55._12_4_ = fVar21 * local_138._12_4_;
          auVar58 = vfmadd231ps_fma(auVar55,local_118,auVar29);
          auVar47 = vmaxss_avx(ZEXT416((uint)(fVar34 - fVar24)),ZEXT816(0) << 0x40);
          fVar21 = auVar47._0_4_;
          fVar22 = 1.0 - fVar21;
          auVar37._0_4_ = fVar21 * local_128.m128[0];
          auVar37._4_4_ = fVar21 * local_128.m128[1];
          auVar37._8_4_ = fVar21 * local_128.m128[2];
          auVar37._12_4_ = fVar21 * local_128.m128[3];
          auVar30._4_4_ = fVar22;
          auVar30._0_4_ = fVar22;
          auVar30._8_4_ = fVar22;
          auVar30._12_4_ = fVar22;
          auVar39 = vfmadd231ps_fma(auVar37,auVar30,(undefined1  [16])local_148);
          auVar41._0_4_ = fVar21 * local_118._0_4_;
          auVar41._4_4_ = fVar21 * local_118._4_4_;
          auVar41._8_4_ = fVar21 * local_118._8_4_;
          auVar41._12_4_ = fVar21 * local_118._12_4_;
          auVar43 = vfmadd231ps_fma(auVar41,auVar30,local_138);
        }
        else {
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_160,(long)(iVar17 + 1));
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_160,(long)((int)fVar34 + -1));
          auVar47 = vmaxss_avx(ZEXT416((uint)fVar21),ZEXT816(0) << 0x40);
          fVar23 = auVar47._0_4_;
          auVar53._0_4_ = fVar23 * local_58.m128[0];
          auVar53._4_4_ = fVar23 * local_58.m128[1];
          auVar53._8_4_ = fVar23 * local_58.m128[2];
          auVar53._12_4_ = fVar23 * local_58.m128[3];
          fVar21 = 1.0 - fVar23;
          auVar26._4_4_ = fVar21;
          auVar26._0_4_ = fVar21;
          auVar26._8_4_ = fVar21;
          auVar26._12_4_ = fVar21;
          auVar54 = vfmadd231ps_fma(auVar53,auVar26,(undefined1  [16])local_128);
          auVar57._0_4_ = fVar23 * local_48;
          auVar57._4_4_ = fVar23 * fStack_44;
          auVar57._8_4_ = fVar23 * fStack_40;
          auVar57._12_4_ = fVar23 * fStack_3c;
          auVar58 = vfmadd231ps_fma(auVar57,auVar26,local_118);
          auVar47 = vmaxss_avx(ZEXT416((uint)(fVar34 - fVar24)),ZEXT816(0) << 0x40);
          fVar24 = auVar47._0_4_;
          fVar21 = 1.0 - fVar24;
          auVar38._0_4_ = fVar24 * local_78.m128[0];
          auVar38._4_4_ = fVar24 * local_78.m128[1];
          auVar38._8_4_ = fVar24 * local_78.m128[2];
          auVar38._12_4_ = fVar24 * local_78.m128[3];
          auVar31._4_4_ = fVar21;
          auVar31._0_4_ = fVar21;
          auVar31._8_4_ = fVar21;
          auVar31._12_4_ = fVar21;
          auVar39 = vfmadd231ps_fma(auVar38,auVar31,(undefined1  [16])local_148);
          auVar42._0_4_ = fVar24 * local_68;
          auVar42._4_4_ = fVar24 * fStack_64;
          auVar42._8_4_ = fVar24 * fStack_60;
          auVar42._12_4_ = fVar24 * fStack_5c;
          auVar43 = vfmadd231ps_fma(auVar42,auVar31,local_138);
          if ((int)(uVar12 + 1) < iVar19) {
            itime = (size_t)(uVar12 + 1);
            iVar19 = ~uVar12 + iVar19;
            do {
              fVar24 = ((float)(int)itime / fVar1 - fVar35) / (fVar22 - fVar35);
              fVar21 = 1.0 - fVar24;
              auVar33._0_4_ = auVar39._0_4_ * fVar24;
              fVar34 = auVar39._4_4_;
              auVar33._4_4_ = fVar34 * fVar24;
              fVar23 = auVar39._8_4_;
              auVar33._8_4_ = fVar23 * fVar24;
              fVar40 = auVar39._12_4_;
              auVar33._12_4_ = fVar40 * fVar24;
              auVar32._4_4_ = fVar21;
              auVar32._0_4_ = fVar21;
              auVar32._8_4_ = fVar21;
              auVar32._12_4_ = fVar21;
              auVar47 = vfmadd231ps_fma(auVar33,auVar32,auVar54);
              auVar27._0_4_ = auVar43._0_4_ * fVar24;
              fVar21 = auVar43._4_4_;
              auVar27._4_4_ = fVar21 * fVar24;
              fVar48 = auVar43._8_4_;
              auVar27._8_4_ = fVar48 * fVar24;
              fVar49 = auVar43._12_4_;
              auVar27._12_4_ = fVar49 * fVar24;
              local_a8 = vfmadd231ps_fma(auVar27,auVar58,auVar32);
              ::anon_func::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_160,itime);
              local_1d8 = auVar58._0_4_;
              fStack_1d4 = auVar58._4_4_;
              fStack_1d0 = auVar58._8_4_;
              fStack_1cc = auVar58._12_4_;
              local_1c8 = auVar54._0_4_;
              fStack_1c4 = auVar54._4_4_;
              fStack_1c0 = auVar54._8_4_;
              fStack_1bc = auVar54._12_4_;
              auVar47 = vsubps_avx((undefined1  [16])local_98,auVar47);
              auVar25 = vsubps_avx(local_88,local_a8);
              auVar36 = vminps_avx(auVar47,ZEXT816(0) << 0x40);
              auVar47 = vmaxps_avx(auVar25,ZEXT816(0) << 0x40);
              auVar54._0_4_ = local_1c8 + auVar36._0_4_;
              auVar54._4_4_ = fStack_1c4 + auVar36._4_4_;
              auVar54._8_4_ = fStack_1c0 + auVar36._8_4_;
              auVar54._12_4_ = fStack_1bc + auVar36._12_4_;
              auVar39._0_4_ = auVar39._0_4_ + auVar36._0_4_;
              auVar39._4_4_ = fVar34 + auVar36._4_4_;
              auVar39._8_4_ = fVar23 + auVar36._8_4_;
              auVar39._12_4_ = fVar40 + auVar36._12_4_;
              auVar58._0_4_ = local_1d8 + auVar47._0_4_;
              auVar58._4_4_ = fStack_1d4 + auVar47._4_4_;
              auVar58._8_4_ = fStack_1d0 + auVar47._8_4_;
              auVar58._12_4_ = fStack_1cc + auVar47._12_4_;
              auVar43._0_4_ = auVar43._0_4_ + auVar47._0_4_;
              auVar43._4_4_ = fVar21 + auVar47._4_4_;
              auVar43._8_4_ = fVar48 + auVar47._8_4_;
              auVar43._12_4_ = fVar49 + auVar47._12_4_;
              itime = itime + 1;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
        }
        aVar8 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar54,ZEXT416(geomID),0x30);
        uVar12 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.numTimeSteps - 1;
        uVar13 = (ulong)uVar12;
        BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar28._8_8_ = 0;
        auVar28._0_4_ = BVar2.lower;
        auVar28._4_4_ = BVar2.upper;
        aVar9 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                vinsertps_avx(auVar58,ZEXT416((uint)uVar18),0x30);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar39,ZEXT416(uVar12),0x30);
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar43,ZEXT416(uVar12),0x30);
        auVar36 = vcmpps_avx(local_1a8,auVar28,1);
        auVar25 = vinsertps_avx(local_1a8,auVar28,0x50);
        auVar47 = vblendps_avx(auVar28,local_1a8,2);
        local_1a8 = vblendvps_avx(auVar47,auVar25,auVar36);
        auVar59._8_4_ = 0x3f000000;
        auVar59._0_8_ = 0x3f0000003f000000;
        auVar59._12_4_ = 0x3f000000;
        auVar44._0_4_ = aVar10.x * 0.5;
        auVar44._4_4_ = aVar10.y * 0.5;
        auVar44._8_4_ = aVar10.z * 0.5;
        auVar44._12_4_ = aVar10.field_3.w * 0.5;
        auVar47 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar8,auVar59);
        auVar50._0_4_ = aVar11.x * 0.5;
        auVar50._4_4_ = aVar11.y * 0.5;
        auVar50._8_4_ = aVar11.z * 0.5;
        auVar50._12_4_ = aVar11.field_3.w * 0.5;
        auVar36 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar9,auVar59);
        auVar45._0_4_ = auVar47._0_4_ + auVar36._0_4_;
        auVar45._4_4_ = auVar47._4_4_ + auVar36._4_4_;
        auVar45._8_4_ = auVar47._8_4_ + auVar36._8_4_;
        auVar45._12_4_ = auVar47._12_4_ + auVar36._12_4_;
        auVar47 = vminps_avx(local_d8,auVar45);
        auVar64 = ZEXT1664(auVar47);
        auVar47 = vmaxps_avx(local_e8,auVar45);
        auVar67 = ZEXT1664(auVar47);
        local_1f0 = local_1f0 + 1;
        local_1e8 = local_1e8 + uVar13;
        bVar20 = local_218 < uVar13;
        auVar46[1] = bVar20;
        auVar46[0] = bVar20;
        auVar46[2] = bVar20;
        auVar46[3] = bVar20;
        auVar46[4] = bVar20;
        auVar46[5] = bVar20;
        auVar46[6] = bVar20;
        auVar46[7] = bVar20;
        auVar46[8] = bVar20;
        auVar46[9] = bVar20;
        auVar46[10] = bVar20;
        auVar46[0xb] = bVar20;
        auVar46[0xc] = bVar20;
        auVar46[0xd] = bVar20;
        auVar46[0xe] = bVar20;
        auVar46[0xf] = bVar20;
        auVar47 = vpslld_avx(auVar46,0x1f);
        local_1b8 = vblendvps_avx(local_1b8,auVar28,auVar47);
        auVar47 = vminps_avx(local_c8,(undefined1  [16])aVar8);
        auVar61 = ZEXT1664(auVar47);
        if (local_218 <= uVar13) {
          local_218 = uVar13;
        }
        pPVar7 = prims->items;
        pPVar7[k].lbounds.bounds0.lower.field_0 = aVar8;
        auVar47 = vmaxps_avx(local_b8,(undefined1  [16])aVar9);
        auVar60 = ZEXT1664(auVar47);
        pPVar7[k].lbounds.bounds0.upper.field_0 = aVar9;
        auVar47 = vminps_avx(local_108,(undefined1  [16])aVar10);
        auVar71 = ZEXT1664(auVar47);
        pPVar7[k].lbounds.bounds1.lower.field_0.field_1 = aVar10;
        auVar47 = vmaxps_avx(local_f8,(undefined1  [16])aVar11);
        auVar69 = ZEXT1664(auVar47);
        pPVar7[k].lbounds.bounds1.upper.field_0.field_1 = aVar11;
        pPVar7[k].time_range = BVar2;
        k = k + 1;
        uVar13 = r->_end;
      }
LAB_0196a972:
      aVar65 = auVar60._0_16_;
      aVar62 = auVar61._0_16_;
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar13);
    (__return_storage_ptr__->object_range)._end = local_1f0;
    aVar70 = auVar71._0_16_;
    aVar68 = auVar69._0_16_;
    aVar63 = auVar64._0_16_;
    aVar66 = auVar67._0_16_;
  }
  else {
    local_1a8 = SUB6416(ZEXT464(0x3f800000),0);
    local_1b8 = ZEXT816(0x3f80000000000000);
    aVar62.m128[2] = INFINITY;
    aVar62._0_8_ = 0x7f8000007f800000;
    aVar62.m128[3] = INFINITY;
    aVar65.m128[2] = -INFINITY;
    aVar65._0_8_ = 0xff800000ff800000;
    aVar65.m128[3] = -INFINITY;
    local_218 = 0;
    local_1e8 = 0;
    aVar70 = aVar62;
    aVar68 = aVar65;
    aVar63 = aVar62;
    aVar66 = aVar65;
  }
  auVar47 = vmovlhps_avx(local_1b8,local_1a8);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar62;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar65;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar70;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar68;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar63;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar66;
  __return_storage_ptr__->num_time_segments = local_1e8;
  __return_storage_ptr__->max_num_time_segments = local_218;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar47._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar47._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar47._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar47._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }